

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_TELEPORT(effect_handler_context_t_conflict *context)

{
  loc_conflict *plVar1;
  undefined2 uVar2;
  loc lVar3;
  uint uVar4;
  _Bool _Var5;
  ushort uVar6;
  int iVar7;
  wchar_t wVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  wchar_t wVar11;
  uint32_t uVar12;
  loc_conflict grid;
  monster *pmVar13;
  loc lVar14;
  square *psVar15;
  monster_conflict *mon;
  int iVar16;
  uint uVar17;
  loc p;
  loc lVar18;
  chunk_conflict *c;
  char *fmt;
  ulong uVar19;
  long lVar20;
  int iVar21;
  bool bVar22;
  _Bool local_61;
  uint local_60;
  
  grid = loc(context->x,context->y);
  uVar4._0_2_ = z_info->dungeon_hgt;
  uVar4._2_2_ = z_info->dungeon_wid;
  if ((ushort)(undefined2)uVar4 < z_info->dungeon_wid) {
    uVar4 = (uint)z_info->dungeon_wid;
  }
  local_61 = true;
  if ((context->origin).what == SRC_MONSTER) {
    local_61 = context->subtype != 0;
  }
  wVar8 = (context->value).base;
  wVar11 = (context->value).m_bonus;
  pmVar13 = monster_target_monster(context);
  context->ident = true;
  if (player->upkeep->arena_level != false) {
    return true;
  }
  _Var5 = loc_is_zero(grid);
  if (_Var5) {
    if (pmVar13 == (monster *)0x0) {
      if (local_61 != false) {
        lVar14 = cave_find_decoy(cave);
        _Var5 = loc_is_zero((loc_conflict)lVar14);
        if ((!_Var5) && (context->subtype != 0)) {
          square_destroy_decoy(cave,lVar14);
          return true;
        }
        plVar1 = &player->grid;
        grid.y = 0;
        grid.x = plVar1->x;
        lVar14.x = plVar1->x;
        lVar14.y = plVar1->y;
        uVar19 = (ulong)(uint)(player->grid).y;
        _Var5 = square_isno_teleport(cave,lVar14);
        if ((!_Var5) || (wVar8 < L'\v' && wVar8 != L'\0')) {
          _Var5 = player_of_has(player,L'\x19');
          if (!_Var5) goto LAB_0013dc79;
          equip_learn_flag(player,L'\x19');
        }
        fmt = "Teleportation forbidden!";
        goto LAB_0013df2d;
      }
      if ((context->origin).what != SRC_MONSTER) {
        __assert_fail("context->origin.what == SRC_MONSTER",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effect-handler-general.c"
                      ,0xa00,"_Bool effect_handler_TELEPORT(effect_handler_context_t *)");
      }
      pmVar13 = cave_monster(cave,(context->origin).which.monster);
    }
    grid.y = 0;
    grid.x = (pmVar13->grid).x;
    uVar19 = (ulong)(uint)(pmVar13->grid).y;
  }
  else {
    uVar19 = (ulong)grid >> 0x20;
  }
LAB_0013dc79:
  iVar21 = grid.x;
  if (wVar11 != L'\0') {
    iVar7 = (int)uVar19;
    iVar16 = cave->height - iVar7;
    if (iVar16 < iVar7) {
      iVar16 = iVar7;
    }
    iVar7 = cave->width - iVar21;
    if (iVar7 < iVar21) {
      iVar7 = iVar21;
    }
    if (iVar7 < iVar16) {
      iVar7 = iVar16;
    }
    wVar8 = (iVar7 * wVar11) / 100;
  }
  local_60 = (uVar4 & 0xffff) * 2;
  uVar9 = Rand_div(2);
  uVar10 = Rand_div(wVar8 / 4);
  uVar12 = -uVar10;
  if (uVar9 != 0) {
    uVar12 = uVar10;
  }
  lVar14 = (loc)((ulong)grid & 0xffffffff | uVar19 << 0x20);
  uVar9 = 0;
  bVar22 = true;
  p.x = L'\0';
  p.y = L'\0';
  c = cave;
  for (lVar20 = 1; lVar20 < (long)c->height + -1; lVar20 = lVar20 + 1) {
    for (uVar19 = 1; (long)uVar19 < (long)c->width + -1; uVar19 = uVar19 + 1) {
      lVar18 = (loc)(lVar20 << 0x20 | uVar19);
      wVar11 = distance((loc_conflict)lVar18,(loc_conflict)lVar14);
      uVar17 = wVar11 - (uVar12 + wVar8);
      uVar4 = -uVar17;
      if (0 < (int)uVar17) {
        uVar4 = uVar17;
      }
      if ((wVar11 != L'\0') &&
         (_Var5 = has_teleport_destination_prereqs((chunk *)cave,lVar18,local_61), _Var5)) {
        _Var5 = square_isvault(cave,lVar18);
        if (_Var5) {
          if (!bVar22) goto LAB_0013ddd2;
        }
        else {
          if (bVar22) {
            uVar2 = z_info->dungeon_hgt;
            uVar6 = uVar2;
            if ((ushort)uVar2 < z_info->dungeon_wid) {
              uVar6 = z_info->dungeon_wid;
            }
            local_60 = (uint)uVar6 * 2;
          }
          bVar22 = false;
        }
        if ((int)uVar4 <= (int)local_60) {
          lVar18 = (loc)mem_zalloc(0x10);
          *(int *)lVar18 = (int)uVar19;
          *(int *)((long)lVar18 + 4) = (int)lVar20;
          if (uVar4 < local_60) {
            while (p != (loc)0x0) {
              lVar3 = *(loc *)((long)p + 8);
              mem_free((void *)p);
              p = lVar3;
            }
            uVar9 = 1;
            p = lVar18;
            local_60 = uVar4;
          }
          else {
            *(loc *)((long)lVar18 + 8) = p;
            uVar9 = uVar9 + 1;
            p = lVar18;
          }
        }
      }
LAB_0013ddd2:
      c = cave;
    }
  }
  if (uVar9 != 0) {
    uVar12 = Rand_div(uVar9);
    while (bVar22 = uVar12 != 0, uVar12 = uVar12 - 1, bVar22) {
      lVar18 = *(loc *)((long)p + 8);
      mem_free((void *)p);
      p = lVar18;
    }
    sound((uint)(local_61 ^ 1U) + (uint)(local_61 ^ 1U) * 4 + 10);
    monster_swap(lVar14,*(loc *)p);
    if (local_61 != false) {
      player_handle_post_move(player,true,(context->origin).what == SRC_MONSTER);
    }
    psVar15 = square(cave,*(loc *)p);
    flag_off(psVar15->info,3,0x12);
    pmVar13 = target_get_monster();
    _Var5 = target_able(pmVar13);
    if (!_Var5) {
      target_set_monster((monster *)0x0);
    }
    handle_stuff(player);
    while (p != (loc)0x0) {
      lVar14 = *(loc *)((long)p + 8);
      mem_free((void *)p);
      p = lVar14;
    }
    return true;
  }
  if (local_61 == false) {
    mon = (monster_conflict *)cave_monster(c,(context->origin).which.monster);
    _Var5 = square_isseen(cave,mon->grid);
    if (!_Var5) {
      return true;
    }
    add_monster_message(mon,L'0',true);
    return true;
  }
  fmt = "Failed to find teleport destination!";
LAB_0013df2d:
  msg(fmt);
  return true;
}

Assistant:

bool effect_handler_TELEPORT(effect_handler_context_t *context)
{
	struct loc start = loc(context->x, context->y);
	int dis = context->value.base;
	int perc = context->value.m_bonus;
	int pick;
	struct loc grid;

	struct jumps {
		struct loc grid;
		struct jumps *next;
	} *spots = NULL;
	int num_spots = 0;
	int current_score = 2 * MAX(z_info->dungeon_wid, z_info->dungeon_hgt);
	bool only_vault_grids_possible = true;

	bool is_player = (context->origin.what != SRC_MONSTER || context->subtype);
	struct monster *t_mon = monster_target_monster(context);

	context->ident = true;

	/* No teleporting in arena levels */
	if (player->upkeep->arena_level) return true;

	/* Establish the coordinates to teleport from, if we don't know already */
	if (!loc_is_zero(start)) {
		/* We're good */
	} else if (t_mon) {
		/* Monster targeting another monster */
		start = t_mon->grid;
	} else if (is_player) {
		/* Decoys get destroyed */
		struct loc decoy = cave_find_decoy(cave);
		if (!loc_is_zero(decoy) && context->subtype) {
			square_destroy_decoy(cave, decoy);
			return true;
		}

		start = player->grid;

		/* Check for a no teleport grid */
		if (square_isno_teleport(cave, start) &&
			((dis > 10) || (dis == 0))) {
			msg("Teleportation forbidden!");
			return true;
		}

		/* Check for a no teleport curse */
		if (player_of_has(player, OF_NO_TELEPORT)) {
			equip_learn_flag(player, OF_NO_TELEPORT);
			msg("Teleportation forbidden!");
			return true;
		}
	} else {
		assert(context->origin.what == SRC_MONSTER);
		struct monster *mon = cave_monster(cave, context->origin.which.monster);
		start = mon->grid;
	}

	/* Percentage of the largest cardinal distance to an edge */
	if (perc) {
		int vertical = MAX(start.y, cave->height - start.y);
		int horizontal = MAX(start.x, cave->width - start.x);
		dis = (MAX(vertical, horizontal) * perc) / 100;
	}

	/* Randomise the distance a little */
	if (one_in_(2)) {
		dis -= randint0(dis / 4);
	} else {
		dis += randint0(dis / 4);
	}

	/* Make a list of the best grids, scoring by how good an approximation
	 * the distance from the start is to the distance we want */
	for (grid.y = 1; grid.y < cave->height - 1; grid.y++) {
		for (grid.x = 1; grid.x < cave->width - 1; grid.x++) {
			int d = distance(grid, start);
			int score = ABS(d - dis);
			struct jumps *new;

			/* Must move */
			if (d == 0) continue;

			if (!has_teleport_destination_prereqs(cave, grid,
					is_player)) continue;

			/* No teleporting into vaults and such, unless there's no choice */
			if (square_isvault(cave, grid)) {
				if (!only_vault_grids_possible) {
					continue;
				}
			} else {
				/* Just starting to consider non-vault grids, so reset score */
				if (only_vault_grids_possible) {
					current_score = 2 * MAX(z_info->dungeon_wid,
											z_info->dungeon_hgt);
				}
				only_vault_grids_possible = false;
			}

			/* Do we have better spots already? */
			if (score > current_score) continue;

			/* Make a new spot */
			new = mem_zalloc(sizeof(struct jumps));
			new->grid = grid;

			/* If improving start a new list, otherwise extend the old one */
			if (score < current_score) {
				current_score = score;
				while (spots) {
					struct jumps *next = spots->next;
					mem_free(spots);
					spots = next;
				}
				spots = new;
				num_spots = 1;
			} else {
				new->next = spots;
				spots = new;
				num_spots++;
			}
		}
	}

	/* Report failure (very unlikely) */
	if (!num_spots) {
		if (is_player) {
			msg("Failed to find teleport destination!");
		} else {
			/*
			 * With either teleport self or teleport other, it'll
			 * be the caster that is puzzled.
			 */
			struct monster *mon = cave_monster(cave,
				context->origin.which.monster);

			if (square_isseen(cave, mon->grid)) {
				add_monster_message(mon, MON_MSG_BRIEF_PUZZLE,
					true);
			}
		}
		return true;
	}

	/* Pick a spot */
	pick = randint0(num_spots);
	while (pick) {
		struct jumps *next = spots->next;
		mem_free(spots);
		spots = next;
		pick--;
	}

	/* Sound */
	sound(is_player ? MSG_TELEPORT : MSG_TPOTHER);

	/* Move player or monster */
	monster_swap(start, spots->grid);
	if (is_player) {
		player_handle_post_move(player, true,
			context->origin.what == SRC_MONSTER);
	}

	/* Clear any projection marker to prevent double processing */
	sqinfo_off(square(cave, spots->grid)->info, SQUARE_PROJECT);

	/* Clear monster target if it's no longer visible */
	if (!target_able(target_get_monster())) {
		target_set_monster(NULL);
	}

	/* Lots of updates after monster_swap */
	handle_stuff(player);

	while (spots) {
		struct jumps *next = spots->next;
		mem_free(spots);
		spots = next;
	}

	return true;
}